

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRetime.c
# Opt level: O3

int Gia_ManMarkAutonomous_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  uint uVar4;
  
  pGVar2 = p->pObjs;
  if ((pObj < pGVar2) || (pGVar2 + p->nObjs <= pObj)) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  iVar1 = (int)((long)pObj - (long)pGVar2 >> 2) * -0x55555555;
  if (p->nTravIdsAlloc <= iVar1) {
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x229,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (p->pTravIds[iVar1] == p->nTravIds) {
    return *(uint *)pObj >> 0x1e & 1;
  }
  p->pTravIds[iVar1] = p->nTravIds;
  pGVar2 = *(Gia_Obj_t **)pObj;
  uVar4 = (uint)pGVar2;
  if ((uVar4 >> 0x1e & 1) != 0) {
    __assert_fail("pObj->fMark0 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaRetime.c"
                  ,0x32,"int Gia_ManMarkAutonomous_rec(Gia_Man_t *, Gia_Obj_t *)");
  }
  if ((~uVar4 & 0x9fffffff) == 0) {
    if (((~(ulong)pGVar2 & 0x1fffffff1fffffff) != 0) &&
       (p->vCis->nSize - p->nRegs <= (int)((uint)((ulong)pGVar2 >> 0x20) & 0x1fffffff))) {
      pGVar2 = Gia_ObjRoToRi(p,pGVar2);
LAB_00710722:
      iVar1 = Gia_ManMarkAutonomous_rec(p,pGVar2);
      *(ulong *)pObj = *(ulong *)pObj & 0xffffffffbfffffff | (ulong)(uint)(iVar1 << 0x1e);
      return iVar1;
    }
  }
  else if ((~(ulong)pGVar2 & 0x1fffffff1fffffff) != 0) {
    uVar3 = (ulong)pGVar2 & 0x1fffffff;
    if (-1 < (int)uVar4 || uVar3 == 0x1fffffff) {
      if (((int)uVar4 < 0) || ((int)uVar3 == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaRetime.c"
                      ,0x39,"int Gia_ManMarkAutonomous_rec(Gia_Man_t *, Gia_Obj_t *)");
      }
      iVar1 = Gia_ManMarkAutonomous_rec(p,pObj + -uVar3);
      if (iVar1 != 0) {
        *(ulong *)pObj = *(ulong *)pObj | 0x40000000;
        return 1;
      }
      uVar3 = (ulong)((uint)(*(ulong *)pObj >> 0x20) & 0x1fffffff);
    }
    pGVar2 = pObj + -uVar3;
    goto LAB_00710722;
  }
  *(ulong *)pObj = (ulong)pGVar2 | 0x40000000;
  return 1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Marks objects reachables from Const0 and PIs/

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Gia_ManMarkAutonomous_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return pObj->fMark0;
    Gia_ObjSetTravIdCurrent(p, pObj);
    assert( pObj->fMark0 == 0 );
    if ( Gia_ObjIsPi(p, pObj) || Gia_ObjIsConst0(pObj) )
        return pObj->fMark0 = 1;
    if ( Gia_ObjIsCo(pObj) )
        return pObj->fMark0 = Gia_ManMarkAutonomous_rec( p, Gia_ObjFanin0(pObj) );
    if ( Gia_ObjIsCi(pObj) )
        return pObj->fMark0 = Gia_ManMarkAutonomous_rec( p, Gia_ObjRoToRi(p, pObj) );
    assert( Gia_ObjIsAnd(pObj) );
    if ( Gia_ManMarkAutonomous_rec( p, Gia_ObjFanin0(pObj) ) )
        return pObj->fMark0 = 1;
    return pObj->fMark0 = Gia_ManMarkAutonomous_rec( p, Gia_ObjFanin1(pObj) );
}